

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Payload>
          (AsciiParser *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Payload *pPVar5;
  Payload *pPVar6;
  bool bVar7;
  char c;
  bool triple_deliminated;
  char ce;
  char local_152;
  bool local_151;
  Payload local_150;
  
  bVar7 = SkipWhitespace(this);
  if ((bVar7) && (bVar7 = Char1(this,&local_152), bVar7)) {
    if (local_152 == '[') {
      bVar7 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (bVar7) {
        bVar7 = Char1(this,(char *)&local_150);
        if (!bVar7) {
          return bVar7;
        }
        if ((char)local_150.asset_path.asset_path_._M_dataplus._M_p == ']') {
          pPVar5 = (result->
                   super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (result->
                   super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pPVar6 != pPVar5) {
            ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar5,pPVar6);
            (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_finish = pPVar5;
            return bVar7;
          }
          return bVar7;
        }
        Rewind(this,1);
        bVar7 = SepBy1BasicType<tinyusdz::Payload>(this,',',']',result);
        if (((bVar7) && (bVar7 = SkipCommentAndWhitespaceAndNewline(this,true), bVar7)) &&
           (bVar7 = Expect(this,']'), bVar7)) {
          return true;
        }
      }
    }
    else {
      Rewind(this,1);
      local_150.asset_path.asset_path_._M_dataplus._M_p =
           (pointer)&local_150.asset_path.asset_path_.field_2;
      local_150.asset_path.asset_path_._M_string_length = 0;
      local_150.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
      local_150.asset_path.resolved_path_._M_dataplus._M_p =
           (pointer)&local_150.asset_path.resolved_path_.field_2;
      local_150.asset_path.resolved_path_._M_string_length = 0;
      local_150.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
      local_150.prim_path._prim_part._M_dataplus._M_p =
           (pointer)&local_150.prim_path._prim_part.field_2;
      local_150.prim_path._prim_part._M_string_length = 0;
      local_150.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
      local_150.prim_path._prop_part._M_dataplus._M_p =
           (pointer)&local_150.prim_path._prop_part.field_2;
      local_150.prim_path._prop_part._M_string_length = 0;
      local_150.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_150.prim_path._variant_part.field_2;
      local_150.prim_path._variant_part._M_string_length = 0;
      local_150.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_150.prim_path._variant_selection_part.field_2;
      local_150.prim_path._variant_selection_part._M_string_length = 0;
      local_150.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
      paVar3 = &local_150.prim_path._variant_part_str.field_2;
      local_150.prim_path._variant_part_str._M_string_length = 0;
      local_150.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
      paVar4 = &local_150.prim_path._element.field_2;
      local_150.prim_path._element._M_string_length = 0;
      local_150.prim_path._element.field_2._M_local_buf[0] = '\0';
      local_150.prim_path._path_type.has_value_ = false;
      local_150.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      local_150.prim_path._valid = false;
      local_150.layerOffset._offset._0_4_ = 0;
      local_150.layerOffset._offset._4_4_ = 0;
      local_150.layerOffset._scale._0_4_ = 0;
      local_150.layerOffset._scale._4_4_ = 0x3ff00000;
      local_151 = false;
      local_150.prim_path._variant_part._M_dataplus._M_p = (pointer)paVar1;
      local_150.prim_path._variant_selection_part._M_dataplus._M_p = (pointer)paVar2;
      local_150.prim_path._variant_part_str._M_dataplus._M_p = (pointer)paVar3;
      local_150.prim_path._element._M_dataplus._M_p = (pointer)paVar4;
      bVar7 = ParsePayload(this,&local_150,&local_151);
      if (bVar7) {
        pPVar5 = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar6 = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar6 != pPVar5) {
          ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(pPVar5,pPVar6);
          (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
          _M_impl.super__Vector_impl_data._M_finish = pPVar5;
        }
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                  (result,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._element._M_dataplus._M_p != paVar4) {
          operator_delete(local_150.prim_path._element._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._element.field_2._M_allocated_capacity._1_7_,
                                   local_150.prim_path._element.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
          operator_delete(local_150.prim_path._variant_part_str._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._variant_part_str.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_150.prim_path._variant_part_str.field_2._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_150.prim_path._variant_selection_part._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._variant_selection_part.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_150.prim_path._variant_selection_part.field_2._M_local_buf
                                   [0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._variant_part._M_dataplus._M_p != paVar1) {
          operator_delete(local_150.prim_path._variant_part._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._variant_part.field_2._M_allocated_capacity.
                                   _1_7_,local_150.prim_path._variant_part.field_2._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._prop_part._M_dataplus._M_p !=
            &local_150.prim_path._prop_part.field_2) {
          operator_delete(local_150.prim_path._prop_part._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._prop_part.field_2._M_allocated_capacity.
                                   _1_7_,local_150.prim_path._prop_part.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.prim_path._prim_part._M_dataplus._M_p !=
            &local_150.prim_path._prim_part.field_2) {
          operator_delete(local_150.prim_path._prim_part._M_dataplus._M_p,
                          CONCAT71(local_150.prim_path._prim_part.field_2._M_allocated_capacity.
                                   _1_7_,local_150.prim_path._prim_part.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.asset_path.resolved_path_._M_dataplus._M_p !=
            &local_150.asset_path.resolved_path_.field_2) {
          operator_delete(local_150.asset_path.resolved_path_._M_dataplus._M_p,
                          CONCAT71(local_150.asset_path.resolved_path_.field_2._M_allocated_capacity
                                   ._1_7_,local_150.asset_path.resolved_path_.field_2._M_local_buf
                                          [0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.asset_path.asset_path_._M_dataplus._M_p !=
            &local_150.asset_path.asset_path_.field_2) {
          operator_delete(local_150.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_150.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_150.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
        return true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._element._M_dataplus._M_p != paVar4) {
        operator_delete(local_150.prim_path._element._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._element.field_2._M_allocated_capacity._1_7_,
                                 local_150.prim_path._element.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
        operator_delete(local_150.prim_path._variant_part_str._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._variant_part_str.field_2._M_allocated_capacity
                                 ._1_7_,local_150.prim_path._variant_part_str.field_2._M_local_buf
                                        [0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_150.prim_path._variant_selection_part._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._variant_selection_part.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_150.prim_path._variant_selection_part.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._variant_part._M_dataplus._M_p != paVar1) {
        operator_delete(local_150.prim_path._variant_part._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._variant_part.field_2._M_allocated_capacity.
                                 _1_7_,local_150.prim_path._variant_part.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._prop_part._M_dataplus._M_p !=
          &local_150.prim_path._prop_part.field_2) {
        operator_delete(local_150.prim_path._prop_part._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                                 local_150.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.prim_path._prim_part._M_dataplus._M_p !=
          &local_150.prim_path._prim_part.field_2) {
        operator_delete(local_150.prim_path._prim_part._M_dataplus._M_p,
                        CONCAT71(local_150.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_150.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.asset_path.resolved_path_._M_dataplus._M_p !=
          &local_150.asset_path.resolved_path_.field_2) {
        operator_delete(local_150.asset_path.resolved_path_._M_dataplus._M_p,
                        CONCAT71(local_150.asset_path.resolved_path_.field_2._M_allocated_capacity.
                                 _1_7_,local_150.asset_path.resolved_path_.field_2._M_local_buf[0])
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.asset_path.asset_path_._M_dataplus._M_p !=
          &local_150.asset_path.asset_path_.field_2) {
        operator_delete(local_150.asset_path.asset_path_._M_dataplus._M_p,
                        CONCAT71(local_150.asset_path.asset_path_.field_2._M_allocated_capacity.
                                 _1_7_,local_150.asset_path.asset_path_.field_2._M_local_buf[0]) + 1
                       );
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Payload> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    DCOUT("Guess non-list version");
    // Guess non-list version
    Payload pl;
    bool triple_deliminated{false};
    if (!ParsePayload(&pl, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(pl);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }

    if (!SepBy1BasicType(',', ']', result)) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }
  }

  return true;
}